

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

void test_arithm<short>(uint length,short value1,short value2,bool allowTrash)

{
  short *psVar1;
  short sVar2;
  short sVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  undefined8 *puVar9;
  int iVar10;
  undefined7 in_register_00000009;
  ushort uVar11;
  short sVar12;
  undefined6 in_register_00000012;
  ulong uVar13;
  uint uVar14;
  undefined6 in_register_00000032;
  ulong uVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  shared_ptr<short> pv1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  shared_ptr<short> pv2;
  shared_ptr<short> presult;
  
  presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       (undefined4)CONCAT71(in_register_00000009,allowTrash);
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)length;
  iVar5 = posix_memalign(&local_58,0x10,(long)(int)length * 2);
  local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar5 == 0) {
    local_78 = local_58;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<short*,void(*)(short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,local_78,sse::common::free<short>);
  iVar5 = posix_memalign(&pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi,0x10,(long)(int)length * 2);
  local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar5 == 0) {
    local_58 = pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<short*,void(*)(short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,local_58,sse::common::free<short>);
  iVar5 = posix_memalign(&local_80,0x10,(long)(int)(length + 1) * 2);
  if (iVar5 != 0) {
    local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_80;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<short*,void(*)(short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,local_80,
             sse::common::free<short>);
  *(undefined2 *)
   ((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + (long)p_Var4 * 2) = 0x7f;
  if (0 < (int)length) {
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var6 * 2) = value1;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var6->_vptr__Sp_counted_base + 1);
    } while (p_Var4 != p_Var6);
    if (0 < (int)length) {
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        *(short *)((long)&local_58->_vptr__Sp_counted_base + (long)p_Var6 * 2) = value2;
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var6->_vptr__Sp_counted_base + 1);
      } while (p_Var4 != p_Var6);
    }
  }
  if (length != 0) {
    lVar7 = 0;
    do {
      if ((*(short *)((long)&local_78->_vptr__Sp_counted_base + lVar7 * 2) != value1) ||
         (*(short *)((long)&local_58->_vptr__Sp_counted_base + lVar7 * 2) != value2)) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar9 + 1) = 0x1a;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      lVar7 = lVar7 + 1;
    } while (length != (uint)lVar7);
  }
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        psVar1 = (short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var6 * 2);
        *psVar1 = *psVar1 + *(short *)((long)&local_58->_vptr__Sp_counted_base + (long)p_Var6 * 2);
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var6->_vptr__Sp_counted_base + 1);
      } while (p_Var4 != p_Var6);
    }
  }
  else if (local_58 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  {
    if (0 < (int)length) {
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        psVar1 = (short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var6 * 2);
        *psVar1 = *psVar1 + *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var6 * 2);
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var6->_vptr__Sp_counted_base + 1);
      } while (p_Var4 != p_Var6);
    }
  }
  else if (0 < (int)length) {
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var6 * 2) =
           *(short *)((long)&local_58->_vptr__Sp_counted_base + (long)p_Var6 * 2) +
           *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var6 * 2);
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var6->_vptr__Sp_counted_base + 1);
    } while (p_Var4 != p_Var6);
  }
  if (length != 0) {
    lVar7 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + lVar7 * 2) != (short)(value2 + value1))
      {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar9 + 1) = 0x22;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      lVar7 = lVar7 + 1;
    } while (length != (uint)lVar7);
  }
  iVar5 = (int)CONCAT62(in_register_00000012,value2);
  uVar14 = (int)CONCAT62(in_register_00000032,value1) - iVar5;
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar14;
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        psVar1 = (short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var8 * 2);
        *psVar1 = *psVar1 - *(short *)((long)&local_58->_vptr__Sp_counted_base + (long)p_Var8 * 2);
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var8->_vptr__Sp_counted_base + 1);
      } while (p_Var4 != p_Var8);
    }
  }
  else if (0 < (int)length) {
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var8 * 2) =
           *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var8 * 2) -
           *(short *)((long)&local_58->_vptr__Sp_counted_base + (long)p_Var8 * 2);
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var8->_vptr__Sp_counted_base + 1);
    } while (p_Var4 != p_Var8);
  }
  sVar12 = (short)uVar14;
  if (length != 0) {
    lVar7 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + lVar7 * 2) != sVar12) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar9 + 1) = 0x2a;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      lVar7 = lVar7 + 1;
    } while (length != (uint)lVar7);
  }
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + (long)p_Var8 * 2) =
             *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var8 * 2) *
             *(short *)((long)&local_58->_vptr__Sp_counted_base + (long)p_Var8 * 2);
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var8->_vptr__Sp_counted_base + 1);
      } while (p_Var4 != p_Var8);
    }
  }
  else if (local_58 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  {
    if (0 < (int)length) {
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + (long)p_Var8 * 2) =
             *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var8 * 2) *
             *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var8 * 2);
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var8->_vptr__Sp_counted_base + 1);
      } while (p_Var4 != p_Var8);
    }
  }
  else if (0 < (int)length) {
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var8 * 2) =
           *(short *)((long)&local_58->_vptr__Sp_counted_base + (long)p_Var8 * 2) *
           *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var8 * 2);
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var8->_vptr__Sp_counted_base + 1);
    } while (p_Var4 != p_Var8);
  }
  if (length != 0) {
    lVar7 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + lVar7 * 2) != (short)(value2 * value1))
      {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar9 + 1) = 0x32;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      lVar7 = lVar7 + 1;
    } while (length != (uint)lVar7);
  }
  presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (int)value1;
  iVar10 = (int)value2;
  uVar13 = (long)presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _4_4_ % (long)iVar10 & 0xffffffff;
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        sVar2 = *(short *)((long)&local_58->_vptr__Sp_counted_base + (long)p_Var8 * 2);
        sVar3 = *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var8 * 2);
        uVar13 = (long)(int)sVar3 % (long)(int)sVar2 & 0xffffffff;
        *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + (long)p_Var8 * 2) = sVar3 / sVar2;
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var8->_vptr__Sp_counted_base + 1);
      } while (p_Var4 != p_Var8);
    }
  }
  else if (0 < (int)length) {
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      sVar2 = *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var8 * 2);
      sVar3 = *(short *)((long)&local_58->_vptr__Sp_counted_base + (long)p_Var8 * 2);
      uVar13 = (long)(int)sVar2 % (long)(int)sVar3 & 0xffffffff;
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var8 * 2) = sVar2 / sVar3;
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var8->_vptr__Sp_counted_base + 1);
    } while (p_Var4 != p_Var8);
  }
  pv1.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4;
  if (length != 0) {
    lVar7 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + lVar7 * 2) != value1 / value2) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar9 + 1) = 0x3a;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      lVar7 = lVar7 + 1;
    } while (length != (uint)lVar7);
  }
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        psVar1 = (short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var8 * 2);
        *psVar1 = *psVar1 + value2;
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var8->_vptr__Sp_counted_base + 1);
      } while (p_Var4 != p_Var8);
    }
  }
  else if (0 < (int)length) {
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      uVar11 = *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var8 * 2) + value2;
      uVar13 = (ulong)uVar11;
      *(ushort *)
       ((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _vptr__Sp_counted_base + (long)p_Var8 * 2) = uVar11;
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var8->_vptr__Sp_counted_base + 1);
    } while (p_Var4 != p_Var8);
  }
  if (length != 0) {
    lVar7 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + lVar7 * 2) != (short)(value2 + value1))
      {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar9 + 1) = 0x43;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      lVar7 = lVar7 + 1;
    } while (length != (uint)lVar7);
  }
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        psVar1 = (short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var8 * 2);
        *psVar1 = *psVar1 - value2;
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var8->_vptr__Sp_counted_base + 1);
      } while (p_Var4 != p_Var8);
    }
  }
  else if (0 < (int)length) {
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      uVar14 = (uint)*(ushort *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var8 * 2) - iVar5
      ;
      uVar13 = (ulong)uVar14;
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var8 * 2) = (short)uVar14;
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var8->_vptr__Sp_counted_base + 1);
    } while (p_Var4 != p_Var8);
  }
  if (length != 0) {
    lVar7 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + lVar7 * 2) != sVar12) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar9 + 1) = 0x4b;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      lVar7 = lVar7 + 1;
    } while (length != (uint)lVar7);
  }
  if (0 < (int)length) {
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      uVar13 = CONCAT62(in_register_00000012,value2) & 0xffffffff;
      sVar12 = (short)uVar13 -
               *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var8 * 2);
      uVar13 = CONCAT62((int6)(uVar13 >> 0x10),sVar12);
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var8 * 2) = sVar12;
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var8->_vptr__Sp_counted_base + 1);
    } while (p_Var4 != p_Var8);
  }
  if (length != 0) {
    uVar13 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + uVar13 * 2) != (short)(value2 - value1)
         ) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar9 + 1) = 0x53;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      uVar13 = uVar13 + 1;
    } while (length != (uint)uVar13);
  }
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        uVar11 = *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var8 * 2) *
                 value2;
        uVar13 = (ulong)uVar11;
        *(ushort *)
         ((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _vptr__Sp_counted_base + (long)p_Var8 * 2) = uVar11;
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var8->_vptr__Sp_counted_base + 1);
      } while (p_Var4 != p_Var8);
    }
  }
  else if (0 < (int)length) {
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      uVar11 = *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var8 * 2) * value2;
      uVar13 = (ulong)uVar11;
      *(ushort *)
       ((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _vptr__Sp_counted_base + (long)p_Var8 * 2) = uVar11;
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var8->_vptr__Sp_counted_base + 1);
    } while (p_Var4 != p_Var8);
  }
  if (length != 0) {
    lVar7 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + lVar7 * 2) != (short)(value2 * value1))
      {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar9 + 1) = 0x5b;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      lVar7 = lVar7 + 1;
    } while (length != (uint)lVar7);
  }
  if (local_78 == pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        sVar12 = *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)p_Var6 * 2);
        uVar13 = (long)(int)sVar12 % (long)iVar10 & 0xffffffff;
        *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + (long)p_Var6 * 2) = sVar12 / value2;
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var6->_vptr__Sp_counted_base + 1);
      } while (p_Var4 != p_Var6);
    }
  }
  else if (0 < (int)length) {
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      sVar12 = *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var6 * 2);
      uVar13 = (long)(int)sVar12 % (long)iVar10 & 0xffffffff;
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var6 * 2) = sVar12 / value2;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var6->_vptr__Sp_counted_base + 1);
    } while (p_Var4 != p_Var6);
  }
  if (length != 0) {
    lVar7 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + lVar7 * 2) != value1 / value2) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10,p_Var6,uVar13);
        *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar9 + 1) = 99;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      lVar7 = lVar7 + 1;
    } while (length != (uint)lVar7);
  }
  uVar13 = (long)iVar10 %
           (long)presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _4_4_;
  uVar15 = (long)iVar10 /
           (long)presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                 _4_4_ & 0xffffffff;
  if (0 < (int)length) {
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      sVar12 = *(short *)((long)&local_78->_vptr__Sp_counted_base + (long)p_Var6 * 2);
      uVar13 = (long)iVar10 % (long)(int)sVar12;
      *(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_vptr__Sp_counted_base + (long)p_Var6 * 2) = value2 / sVar12;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var6->_vptr__Sp_counted_base + 1);
    } while (p_Var4 != p_Var6);
  }
  if (length != 0) {
    lVar7 = 0;
    do {
      if (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + lVar7 * 2) != (short)uVar15) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10,uVar15,uVar13 & 0xffffffff);
        *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
        *(undefined4 *)(puVar9 + 1) = 0x6b;
        *(uint *)((long)puVar9 + 0xc) = length;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
      lVar7 = lVar7 + 1;
    } while (length != (uint)lVar7);
  }
  if (((char)presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi == '\0'
      ) && (*(short *)((long)&(pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi)->_vptr__Sp_counted_base + (long)p_Var4 * 2) != 0x7f)) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x10,uVar15,uVar13 & 0xffffffff);
    *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = short]";
    *(undefined4 *)(puVar9 + 1) = 0x70;
    *(uint *)((long)puVar9 + 0xc) = length;
    __cxa_throw(puVar9,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}